

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_2,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int i;
  undefined8 *puVar7;
  long lVar8;
  int row;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  Mat3 m;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res;
  Mat3 m_1;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  Vec4 *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  float local_90 [4];
  float local_80 [4];
  float local_70 [4];
  Matrix<float,_3,_3> local_60;
  undefined8 local_38;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  
  puVar7 = &local_d8;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar8 != lVar10) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)puVar7 + lVar10) = uVar11;
      lVar10 = lVar10 + 0xc;
    } while (lVar10 != 0x24);
    lVar9 = lVar9 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
    lVar8 = lVar8 + 0xc;
  } while (lVar9 != 3);
  uVar4 = *(undefined8 *)evalCtx->in[0].m_data;
  fVar2 = evalCtx->in[0].m_data[2];
  local_d8 = *(undefined8 *)evalCtx->in[0].m_data;
  fVar3 = evalCtx->in[1].m_data[0];
  pfVar1 = evalCtx->in[1].m_data + 1;
  uVar5 = *(undefined8 *)pfVar1;
  _fStack_d0 = CONCAT44(fVar3,fVar2);
  local_c8 = *(undefined8 *)pfVar1;
  uVar6 = *(undefined8 *)evalCtx->in[2].m_data;
  local_b8 = evalCtx->in[2].m_data[2];
  uStack_c0 = *(undefined8 *)evalCtx->in[2].m_data;
  local_60.m_data.m_data[0].m_data[2] = 0.0;
  local_60.m_data.m_data[0].m_data[0] = 0.0;
  local_60.m_data.m_data[0].m_data[1] = 0.0;
  lVar8 = 0;
  do {
    local_60.m_data.m_data[0].m_data[lVar8] =
         *(float *)((long)&local_d8 + lVar8 * 4) + (&fStack_cc)[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar8 = 0;
  do {
    local_80[lVar8] =
         local_60.m_data.m_data[0].m_data[lVar8] + *(float *)((long)&uStack_c0 + lVar8 * 4);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  puVar7 = &local_38;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar11 = 0x3f800000;
      if (lVar8 != lVar10) {
        uVar11 = 0;
      }
      *(undefined4 *)((long)puVar7 + lVar10) = uVar11;
      lVar10 = lVar10 + 0xc;
    } while (lVar10 != 0x24);
    lVar9 = lVar9 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 4);
    lVar8 = lVar8 + 0xc;
  } while (lVar9 != 3);
  _fStack_30 = CONCAT44(fVar3,fVar2);
  local_38 = uVar4;
  local_28 = uVar5;
  uStack_20 = uVar6;
  local_18 = local_b8;
  decrement<float,3,3>(&local_60,(MatrixCaseUtils *)&local_38,(Matrix<float,_3,_3> *)0x3);
  local_a0 = (ulong)local_a0._4_4_ << 0x20;
  local_a8 = (Vec4 *)0x0;
  lVar8 = 0;
  do {
    *(float *)((long)&local_a8 + lVar8 * 4) =
         local_60.m_data.m_data[0].m_data[lVar8] + local_60.m_data.m_data[1].m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar8 = 0;
  do {
    local_90[lVar8] =
         *(float *)((long)&local_a8 + lVar8 * 4) + local_60.m_data.m_data[2].m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  local_70[2] = 0.0;
  lVar8 = 0;
  do {
    local_80[lVar8 + 4] = local_80[lVar8] + local_90[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_a8 = &evalCtx->color;
  local_a0 = 0x100000000;
  local_98 = 2;
  lVar8 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a8 + lVar8 * 4)] = local_80[lVar8 + 2];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}